

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  uint64_t uVar4;
  int iVar5;
  int *piVar6;
  run_container_t *run;
  long lVar7;
  min_max_sum_t mms;
  undefined8 local_30;
  uint64_t local_28;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar4 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar4;
  local_30 = 0xffffffff;
  local_28 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_30);
  stat->max_value = (int)((ulong)local_30 >> 0x20);
  stat->min_value = (int)local_30;
  stat->sum_value = local_28;
  if (0 < (r->high_low_container).size) {
    lVar7 = 0;
    do {
      run = (run_container_t *)(r->high_low_container).containers[lVar7];
      uVar2 = (r->high_low_container).typecodes[lVar7];
      uVar1 = uVar2;
      if (uVar2 == '\x04') {
        uVar1 = *(uint8_t *)&run->runs;
        uVar2 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar2 == '\x03') {
        iVar3 = run_container_cardinality(run);
      }
      else {
        iVar3 = run->n_runs;
      }
      piVar6 = (int *)(r->high_low_container).containers[lVar7];
      uVar2 = (r->high_low_container).typecodes[lVar7];
      if (uVar2 == '\x04') {
        uVar2 = (uint8_t)piVar6[2];
        piVar6 = *(int **)piVar6;
      }
      if (uVar2 == '\x01') {
        iVar5 = 0x2000;
      }
      else if (uVar2 == '\x03') {
        iVar5 = *piVar6 * 4 + 2;
      }
      else {
        iVar5 = *piVar6 * 2;
      }
      if (uVar1 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + iVar3;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar5;
      }
      else if (uVar1 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + iVar3;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar5;
      }
      else {
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar3;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}